

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

intptr_t http_listen(char *port,char *binding,http_settings_s arg_settings)

{
  http_settings_s arg_settings_00;
  fio_listen_args args;
  intptr_t iVar1;
  long lVar2;
  http_settings_s *phVar3;
  code **ppcVar4;
  code *local_d8;
  char *pcStackY_d0;
  char *local_c8;
  void *pvStackY_c0;
  http_settings_s *local_b8;
  undefined8 uStackY_b0;
  code *local_a8;
  undefined1 in_stack_ffffffffffffff60 [32];
  undefined1 in_stack_ffffffffffffff80 [40];
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  if (arg_settings.on_request != (_func_void_http_s_ptr *)0x0) {
    phVar3 = &arg_settings;
    ppcVar4 = &local_d8;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      *ppcVar4 = phVar3->on_request;
      phVar3 = (http_settings_s *)&phVar3->on_upgrade;
      ppcVar4 = ppcVar4 + 1;
    }
    arg_settings_00.udata = (void *)in_stack_ffffffffffffff80._0_8_;
    arg_settings_00.public_folder = (char *)in_stack_ffffffffffffff80._8_8_;
    arg_settings_00.public_folder_length = in_stack_ffffffffffffff80._16_8_;
    arg_settings_00.max_header_size = in_stack_ffffffffffffff80._24_8_;
    arg_settings_00.max_body_size = in_stack_ffffffffffffff80._32_8_;
    arg_settings_00.on_request = (_func_void_http_s_ptr *)in_stack_ffffffffffffff60._0_8_;
    arg_settings_00.on_upgrade =
         (_func_void_http_s_ptr_char_ptr_size_t *)in_stack_ffffffffffffff60._8_8_;
    arg_settings_00.on_response = (_func_void_http_s_ptr *)in_stack_ffffffffffffff60._16_8_;
    arg_settings_00.on_finish = (_func_void_http_settings_s_ptr *)in_stack_ffffffffffffff60._24_8_;
    arg_settings_00.max_clients = in_stack_ffffffffffffffa8;
    arg_settings_00.tls = (void *)in_stack_ffffffffffffffb0;
    arg_settings_00.reserved1 = in_stack_ffffffffffffffb8;
    arg_settings_00.reserved2 = in_stack_ffffffffffffffc0;
    arg_settings_00.reserved3 = in_stack_ffffffffffffffc8;
    arg_settings_00.ws_max_msg_size = in_stack_ffffffffffffffd0;
    arg_settings_00.timeout = (char)in_stack_ffffffffffffffd8;
    arg_settings_00.ws_timeout = (char)((ulong)in_stack_ffffffffffffffd8 >> 8);
    arg_settings_00.log = (char)((ulong)in_stack_ffffffffffffffd8 >> 0x10);
    arg_settings_00.is_client = (char)((ulong)in_stack_ffffffffffffffd8 >> 0x18);
    arg_settings_00._124_4_ = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    local_b8 = http_settings_new(arg_settings_00);
    local_b8->is_client = '\0';
    if (local_b8->tls != (void *)0x0) {
      fio_tls_alpn_add(local_b8->tls,"http/1.1",http_on_server_protocol_http1,(void *)0x0,
                       (_func_void_void_ptr *)0x0);
    }
    local_a8 = http_on_finish;
    uStackY_b0 = 0;
    pvStackY_c0 = arg_settings.tls;
    local_d8 = http_on_open;
    args.on_start = http_on_open;
    args.on_open = (_func_void_intptr_t_void_ptr *)in_stack_ffffffffffffff80._0_8_;
    args.port = (char *)in_stack_ffffffffffffff80._8_8_;
    args.address = (char *)in_stack_ffffffffffffff80._16_8_;
    args.tls = (void *)in_stack_ffffffffffffff80._24_8_;
    args.udata = (void *)in_stack_ffffffffffffff80._32_8_;
    args.on_finish = (_func_void_intptr_t_void_ptr *)port;
    pcStackY_d0 = port;
    local_c8 = binding;
    iVar1 = fio_listen(args);
    return iVar1;
  }
  if (1 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("ERROR: http_listen requires the .on_request parameter to be set\n");
  }
  kill(0,2);
  exit(0xb);
}

Assistant:

intptr_t http_listen(const char *port, const char *binding,
                     struct http_settings_s arg_settings) {
  if (arg_settings.on_request == NULL) {
    FIO_LOG_ERROR("http_listen requires the .on_request parameter "
                  "to be set\n");
    kill(0, SIGINT);
    exit(11);
  }

  http_settings_s *settings = http_settings_new(arg_settings);
  settings->is_client = 0;
  if (settings->tls) {
    fio_tls_alpn_add(settings->tls, "http/1.1", http_on_server_protocol_http1,
                     NULL, NULL);
  }

  return fio_listen(.port = port, .address = binding, .tls = arg_settings.tls,
                    .on_finish = http_on_finish, .on_open = http_on_open,
                    .udata = settings);
}